

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O1

int __thiscall ncnn::Interp::load_param(Interp *this,ParamDict *pd)

{
  int iVar1;
  int iVar2;
  float fVar3;
  string local_68;
  string local_48;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->resize_type = iVar1;
  fVar3 = ParamDict::get(pd,1,1.0);
  this->height_scale = fVar3;
  fVar3 = ParamDict::get(pd,2,1.0);
  this->width_scale = fVar3;
  iVar1 = ParamDict::get(pd,3,0);
  this->output_height = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->output_width = iVar1;
  iVar1 = ParamDict::get(pd,5,0);
  this->dynamic_target_size = iVar1;
  iVar1 = ParamDict::get(pd,6,0);
  this->align_corner = iVar1;
  if ((uint)this->resize_type < 4) {
    if (this->dynamic_target_size == 1) {
      (this->super_Layer).one_blob_only = false;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    ParamDict::get(&local_48,pd,9,&local_68);
    std::__cxx11::string::operator=((string *)&this->size_expr,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    iVar1 = 0;
    if ((this->size_expr)._M_string_length != 0) {
      iVar2 = count_expression_blobs(&this->size_expr);
      iVar1 = 0;
      if (1 < iVar2) {
        (this->super_Layer).one_blob_only = false;
      }
    }
  }
  else {
    load_param((Interp *)(ulong)(uint)this->resize_type);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int Interp::load_param(const ParamDict& pd)
{
    resize_type = pd.get(0, 0);
    height_scale = pd.get(1, 1.f);
    width_scale = pd.get(2, 1.f);
    output_height = pd.get(3, 0);
    output_width = pd.get(4, 0);
    dynamic_target_size = pd.get(5, 0);
    align_corner = pd.get(6, 0);

    if (resize_type < 0 || resize_type > 3)
    {
        NCNN_LOGE("unsupported resize type %d", resize_type);
        return -1;
    }

    if (dynamic_target_size == 1)
    {
        one_blob_only = false;
    }

    size_expr = pd.get(9, "");

    // count reference blobs
    if (!size_expr.empty())
    {
        const int blob_count = count_expression_blobs(size_expr);
        if (blob_count > 1)
            one_blob_only = false;
    }

    return 0;
}